

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O1

void __thiscall
brotli::BlockEncoder::StoreSymbol
          (BlockEncoder *this,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  
  if (this->block_len_ == 0) {
    sVar3 = this->block_ix_;
    this->block_ix_ = sVar3 + 1;
    this->block_len_ =
         (ulong)(this->block_lengths_->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar3 + 1];
    this->entropy_ix_ =
         (ulong)(this->block_types_->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar3 + 1] * this->alphabet_size_;
    StoreBlockSwitch(&this->block_split_code_,sVar3 + 1,storage_ix,storage);
  }
  this->block_len_ = this->block_len_ - 1;
  lVar5 = symbol + this->entropy_ix_;
  bVar1 = (this->depths_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5];
  uVar2 = (this->bits_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5];
  if (uVar2 >> (bVar1 & 0x3f) == 0) {
    if (bVar1 < 0x39) {
      uVar4 = *storage_ix;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)uVar2 << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = bVar1 + uVar4;
      return;
    }
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                  ,0x2d,
                  "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                 );
  }
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                ,0x2c,
                "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)")
  ;
}

Assistant:

void StoreSymbol(size_t symbol, size_t* storage_ix, uint8_t* storage) {
    if (block_len_ == 0) {
      ++block_ix_;
      block_len_ = block_lengths_[block_ix_];
      entropy_ix_ = block_types_[block_ix_] * alphabet_size_;
      StoreBlockSwitch(block_split_code_, block_ix_, storage_ix, storage);
    }
    --block_len_;
    size_t ix = entropy_ix_ + symbol;
    WriteBits(depths_[ix], bits_[ix], storage_ix, storage);
  }